

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

bool __thiscall QTextDocumentPrivate::ensureMaximumBlockCount(QTextDocumentPrivate *this)

{
  quint32 qVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextCursor local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = this->maximumBlockCount;
  if ((iVar3 < 1) ||
     (qVar1 = ((this->blocks).data.field_0.head)->node_count, iVar4 = qVar1 - iVar3,
     iVar4 == 0 || (int)qVar1 < iVar3)) {
    bVar2 = false;
  }
  else {
    iVar3 = this->editBlock;
    this->editBlock = iVar3 + 1;
    if (iVar3 == 0) {
      this->revision = this->revision + 1;
    }
    local_40.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&local_40,this,0);
    QTextCursor::movePosition(&local_40,NextBlock,KeepAnchor,iVar4);
    iVar3 = QTextCursor::selectionEnd(&local_40);
    iVar4 = QTextCursor::selectionStart(&local_40);
    this->unreachableCharacterCount = this->unreachableCharacterCount + (iVar3 - iVar4);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockCharFormat((QTextCursor *)local_38);
    QTextCursor::removeSelectedText(&local_40);
    QTextCursor::setBlockCharFormat(&local_40,(QTextCharFormat *)local_38);
    endEditBlock(this);
    compressPieceTable(this);
    QTextFormat::~QTextFormat((QTextFormat *)local_38);
    QTextCursor::~QTextCursor(&local_40);
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextDocumentPrivate::ensureMaximumBlockCount()
{
    if (maximumBlockCount <= 0)
        return false;
    if (blocks.numNodes() <= maximumBlockCount)
        return false;

    beginEditBlock();

    const int blocksToRemove = blocks.numNodes() - maximumBlockCount;
    QTextCursor cursor(this, 0);
    cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor, blocksToRemove);

    unreachableCharacterCount += cursor.selectionEnd() - cursor.selectionStart();

    // preserve the char format of the paragraph that is to become the new first one
    QTextCharFormat charFmt = cursor.blockCharFormat();
    cursor.removeSelectedText();
    cursor.setBlockCharFormat(charFmt);

    endEditBlock();

    compressPieceTable();

    return true;
}